

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

error_code __thiscall
std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>::
set_option<std::experimental::net::v1::detail::socket_option::boolean<1,2>>
          (reactive_socket_service<std::experimental::net::v1::ip::tcp> *this,
          implementation_type *impl,boolean<1,_2> *option,error_code *ec)

{
  int __fd;
  int __optname;
  uint uVar1;
  int *piVar2;
  ulong *in_RCX;
  boolean<1,_2> *in_RDX;
  int *in_RSI;
  error_code eVar3;
  
  __fd = *in_RSI;
  __optname = webfront::http::std::experimental::net::v1::detail::socket_option::boolean<1,_2>::
              level<std::experimental::net::v1::ip::tcp>(in_RDX,(tcp *)(in_RSI + 4));
  uVar1 = webfront::http::std::experimental::net::v1::detail::socket_option::boolean<1,_2>::
          name<std::experimental::net::v1::ip::tcp>(in_RDX,(tcp *)(in_RSI + 4));
  piVar2 = webfront::http::std::experimental::net::v1::detail::socket_option::boolean<1,_2>::
           data<std::experimental::net::v1::ip::tcp>(in_RDX,(tcp *)(in_RSI + 4));
  webfront::http::std::experimental::net::v1::detail::socket_option::boolean<1,_2>::
  size<std::experimental::net::v1::ip::tcp>(in_RDX,(tcp *)(in_RSI + 4));
  webfront::http::std::experimental::net::v1::detail::socket_ops::setsockopt
            (__fd,(int)in_RSI + 4,__optname,(void *)(ulong)uVar1,(socklen_t)piVar2);
  eVar3._0_8_ = *in_RCX & 0xffffffff;
  eVar3._M_cat = (error_category *)in_RCX[1];
  return eVar3;
}

Assistant:

std::error_code set_option(implementation_type& impl,
      const Option& option, std::error_code& ec)
  {
    socket_ops::setsockopt(impl.socket_, impl.state_,
        option.level(impl.protocol_), option.name(impl.protocol_),
        option.data(impl.protocol_), option.size(impl.protocol_), ec);
    return ec;
  }